

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::anon_unknown_2::GenerateCMessage
               (Descriptor *message,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  byte bVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  string c_name;
  undefined1 local_c8 [16];
  _Rb_tree_node_base local_b8;
  size_t local_98;
  string php_name;
  string local_70;
  string local_50;
  
  c_name._M_dataplus._M_p = (pointer)&c_name.field_2;
  lVar4 = *(long *)(*(long *)(message + 8) + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&c_name,lVar4,*(long *)(*(long *)(message + 8) + 0x28) + lVar4);
  php_name._M_dataplus._M_p = (pointer)&php_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&php_name,".","");
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_","");
  StringReplace((string *)local_c8,&c_name,&php_name,&local_70,true);
  std::__cxx11::string::operator=((string *)&c_name,(string *)local_c8);
  if ((_Rb_tree_node_base *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)php_name._M_dataplus._M_p != &php_name.field_2) {
    operator_delete(php_name._M_dataplus._M_p);
  }
  local_b8._0_8_ = 0;
  local_b8._M_parent = (_Base_ptr)0x0;
  local_c8._0_8_ = (_Rb_tree_node_base *)0x0;
  local_c8._8_8_ = 0;
  local_b8._M_left = &local_b8;
  local_98 = 0;
  local_b8._M_right = local_b8._M_left;
  FullClassName<google::protobuf::Descriptor>(&php_name,message,(Options *)local_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_c8 + 8));
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\\","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\\\\","");
  StringReplace((string *)local_c8,&php_name,&local_70,&local_50,true);
  std::__cxx11::string::operator=((string *)&php_name,(string *)local_c8);
  if ((_Rb_tree_node_base *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_c8,*(_anonymous_namespace_ **)**(long **)(message + 0x10),
             (FileDescriptor *)((undefined8 *)**(long **)(message + 0x10))[1]);
  io::Printer::Print<char[12],std::__cxx11::string,char[7],std::__cxx11::string>
            (printer,
             "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nstatic PHP_METHOD($c_name$, __construct) {\n  $file_c_name$_AddDescriptor();\n  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n}\n\n"
             ,(char (*) [12])"file_c_name",(string *)local_c8,(char (*) [7])0x3e9007,&c_name);
  if ((_Rb_tree_node_base *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (0 < *(int *)(message + 4)) {
    lVar4 = 8;
    lVar6 = 0;
    do {
      psVar2 = *(string **)(*(long *)(message + 0x28) + lVar4);
      UnderscoresToCamelCase((string *)local_c8,psVar2,true);
      io::Printer::
      Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,
                 "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n                                           \"$name$\");\n  zval ret;\n  Message_get(intern, f, &ret);\n  RETURN_COPY_VALUE(&ret);\n}\n\nstatic PHP_METHOD($c_name$, set$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n                                           \"$name$\");\n  zval *val;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n      == FAILURE) {\n    return;\n  }\n  Message_set(intern, f, val);\n  RETURN_COPY(getThis());\n}\n\n"
                 ,(char (*) [7])0x3e9007,&c_name,(char (*) [5])0x3ea8a1,psVar2,
                 (char (*) [11])"camel_name",(string *)local_c8);
      if ((_Rb_tree_node_base *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x48;
    } while (lVar6 < *(int *)(message + 4));
  }
  if (0 < *(int *)(message + 0x6c)) {
    lVar4 = 8;
    lVar6 = 0;
    do {
      psVar2 = *(string **)(*(long *)(message + 0x30) + lVar4);
      UnderscoresToCamelCase((string *)local_c8,psVar2,true);
      io::Printer::
      Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,
                 "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_oneofdef *oneof = upb_msgdef_ntooz(intern->desc->msgdef,\n                                              \"$name$\");\n  const upb_fielddef *field = upb_msg_whichoneof(intern->msg, oneof);\n  RETURN_STRING(field ? upb_fielddef_name(field) : \"\");\n}\n"
                 ,(char (*) [7])0x3e9007,&c_name,(char (*) [5])0x3ea8a1,psVar2,
                 (char (*) [11])"camel_name",(string *)local_c8);
      if ((_Rb_tree_node_base *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar6 < *(int *)(message + 0x6c));
  }
  bVar3 = (byte)message[1] >> 2 & 0x1f;
  if (bVar3 == 10) {
    pcVar5 = 
    "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n  ZEND_ARG_INFO(0, proto)\nZEND_END_ARG_INFO()\n\n"
    ;
LAB_0027e0f2:
    io::Printer::Print<>(printer,pcVar5);
  }
  else if (bVar3 == 0xd) {
    pcVar5 = 
    "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n  ZEND_ARG_INFO(0, datetime)\nZEND_END_ARG_INFO()\n\n"
    ;
    goto LAB_0027e0f2;
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,
             "static zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n"
             ,(char (*) [7])0x3e9007,&c_name);
  if (0 < *(int *)(message + 4)) {
    lVar6 = 8;
    lVar4 = 0;
    do {
      UnderscoresToCamelCase
                ((string *)local_c8,*(string **)(*(long *)(message + 0x28) + lVar6),true);
      io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,
                 "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n"
                 ,(char (*) [7])0x3e9007,&c_name,(char (*) [11])"camel_name",(string *)local_c8);
      if ((_Rb_tree_node_base *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 0x48;
    } while (lVar4 < *(int *)(message + 4));
  }
  if (0 < *(int *)(message + 0x6c)) {
    lVar6 = 8;
    lVar4 = 0;
    do {
      UnderscoresToCamelCase
                ((string *)local_c8,*(string **)(*(long *)(message + 0x30) + lVar6),true);
      io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,"  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
                 (char (*) [7])0x3e9007,&c_name,(char (*) [11])"camel_name",(string *)local_c8);
      if ((_Rb_tree_node_base *)local_c8._0_8_ != &local_b8) {
        operator_delete((void *)local_c8._0_8_);
      }
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 0x28;
    } while (lVar4 < *(int *)(message + 0x6c));
  }
  bVar3 = (byte)message[1] >> 2 & 0x1f;
  if (bVar3 == 10) {
    pcVar5 = 
    "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n"
    ;
  }
  else {
    if (bVar3 != 0xd) goto LAB_0027e230;
    pcVar5 = 
    "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n"
    ;
  }
  io::Printer::Print<char[7],std::__cxx11::string>(printer,pcVar5,(char (*) [7])0x3e9007,&c_name);
LAB_0027e230:
  io::Printer::Print<char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,
             "  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n  $c_name$_ce->create_object = Message_create;\n  zend_do_inheritance($c_name$_ce, message_ce);\n}\n\n"
             ,(char (*) [7])0x3e9007,&c_name,(char (*) [9])"php_name",&php_name);
  if (0 < *(int *)(message + 0x70)) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      GenerateCMessage((Descriptor *)(*(long *)(message + 0x38) + lVar6),printer);
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 0x88;
    } while (lVar4 < *(int *)(message + 0x70));
  }
  if (0 < *(int *)(message + 0x74)) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      GenerateCEnum((EnumDescriptor *)(*(long *)(message + 0x40) + lVar6),printer);
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 0x48;
    } while (lVar4 < *(int *)(message + 0x74));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)php_name._M_dataplus._M_p != &php_name.field_2) {
    operator_delete(php_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)c_name._M_dataplus._M_p != &c_name.field_2) {
    operator_delete(c_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateCMessage(const Descriptor* message, io::Printer* printer) {
  std::string c_name = message->full_name();
  c_name = StringReplace(c_name, ".", "_", true);
  std::string php_name = FullClassName(message, Options());
  php_name = StringReplace(php_name, "\\", "\\\\", true);
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "static PHP_METHOD($c_name$, __construct) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n"
      "}\n"
      "\n",
      "file_c_name", FilenameCName(message->file()),
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
      "static PHP_METHOD($c_name$, get$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n"
      "                                           \"$name$\");\n"
      "  zval ret;\n"
      "  Message_get(intern, f, &ret);\n"
      "  RETURN_COPY_VALUE(&ret);\n"
      "}\n"
      "\n"
      "static PHP_METHOD($c_name$, set$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n"
      "                                           \"$name$\");\n"
      "  zval *val;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n"
      "      == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  Message_set(intern, f, val);\n"
      "  RETURN_COPY(getThis());\n"
      "}\n"
      "\n",
      "c_name", c_name,
      "name", field->name(),
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
      "static PHP_METHOD($c_name$, get$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_oneofdef *oneof = upb_msgdef_ntooz(intern->desc->msgdef,\n"
      "                                              \"$name$\");\n"
      "  const upb_fielddef *field = upb_msg_whichoneof(intern->msg, oneof);\n"
      "  RETURN_STRING(field ? upb_fielddef_name(field) : \"\");\n"
      "}\n",
      "c_name", c_name,
      "name", oneof->name(),
      "camel_name", UnderscoresToCamelCase(oneof->name(), true));
  }

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, proto)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n"
      );
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, datetime)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n"
      );
      break;
    default:
      break;
  }

  printer->Print(
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
      "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n"
      "  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name,
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
      "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name,
      "camel_name", UnderscoresToCamelCase(oneof->name(), true));
  }

  // Extra hand-written functions added to the well-known types.
  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
        "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name);
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
        "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name);
      break;
    default:
      break;
  } 

  printer->Print(
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
      "  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n"
      "  $c_name$_ce->create_object = Message_create;\n"
      "  zend_do_inheritance($c_name$_ce, message_ce);\n"
      "}\n"
      "\n",
      "c_name", c_name,
      "php_name", php_name);

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateCMessage(message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateCEnum(message->enum_type(i), printer);
  }
}